

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnElse(TypeChecker *this)

{
  bool bVar1;
  Result RVar2;
  Label *local_28;
  Label *label;
  TypeChecker *pTStack_18;
  Result result;
  TypeChecker *this_local;
  
  pTStack_18 = this;
  Result::Result((Result *)((long)&label + 4),Ok);
  RVar2 = TopLabel(this,&local_28);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = CheckLabelType(this,local_28,If);
    Result::operator|=((Result *)((long)&label + 4),RVar2);
    RVar2 = PopAndCheckSignature(this,&local_28->result_types,"`if true` branch");
    Result::operator|=((Result *)((long)&label + 4),RVar2);
    RVar2 = CheckTypeStackEnd(this,"`if true` branch");
    Result::operator|=((Result *)((long)&label + 4),RVar2);
    ResetTypeStackToLabel(this,local_28);
    PushTypes(this,&local_28->param_types);
    local_28->label_type = Else;
    local_28->unreachable = false;
    this_local._4_4_ = label._4_4_;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnElse() {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= CheckLabelType(label, LabelType::If);
  result |= PopAndCheckSignature(label->result_types, "`if true` branch");
  result |= CheckTypeStackEnd("`if true` branch");
  ResetTypeStackToLabel(label);
  PushTypes(label->param_types);
  label->label_type = LabelType::Else;
  label->unreachable = false;
  return result;
}